

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::createSubgroupOperation
          (TGlslangToSpvTraverser *this,TOperator op,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,TBasicType typeProxy)

{
  bool bVar1;
  bool bVar2;
  Id IVar3;
  reference puVar4;
  bool bVar5;
  IdImmediate local_7c;
  IdImmediate direction;
  Id directionId;
  IdImmediate operand;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  const_iterator opIt;
  IdImmediate groupOperand;
  IdImmediate executionScope;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> spvGroupOperands;
  GroupOperation groupOperation;
  Op opCode;
  bool isBool;
  bool isFloat;
  bool isUnsigned;
  TBasicType typeProxy_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *operands_local;
  Id typeId_local;
  TOperator op_local;
  TGlslangToSpvTraverser *this_local;
  
  switch(op) {
  case EOpSubgroupElect:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    break;
  case EOpSubgroupBroadcast:
  case EOpSubgroupBroadcastFirst:
  case EOpSubgroupBallot:
  case EOpSubgroupInverseBallot:
  case EOpSubgroupBallotBitExtract:
  case EOpSubgroupBallotBitCount:
  case EOpSubgroupBallotInclusiveBitCount:
  case EOpSubgroupBallotExclusiveBitCount:
  case EOpSubgroupBallotFindLSB:
  case EOpSubgroupBallotFindMSB:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformBallot);
    break;
  case EOpSubgroupShuffle:
  case EOpSubgroupShuffleXor:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformShuffle);
    break;
  case EOpSubgroupShuffleUp:
  case EOpSubgroupShuffleDown:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformShuffleRelative);
    break;
  case EOpSubgroupRotate:
  case EOpSubgroupClusteredRotate:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_subgroup_rotate");
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformRotateKHR);
    break;
  case EOpSubgroupAdd:
  case EOpSubgroupMul:
  case EOpSubgroupMin:
  case EOpSubgroupMax:
  case EOpSubgroupAnd:
  case EOpSubgroupOr:
  case EOpSubgroupXor:
  case EOpSubgroupInclusiveAdd:
  case EOpSubgroupInclusiveMul:
  case EOpSubgroupInclusiveMin:
  case EOpSubgroupInclusiveMax:
  case EOpSubgroupInclusiveAnd:
  case EOpSubgroupInclusiveOr:
  case EOpSubgroupInclusiveXor:
  case EOpSubgroupExclusiveAdd:
  case EOpSubgroupExclusiveMul:
  case EOpSubgroupExclusiveMin:
  case EOpSubgroupExclusiveMax:
  case EOpSubgroupExclusiveAnd:
  case EOpSubgroupExclusiveOr:
  case EOpSubgroupExclusiveXor:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformArithmetic);
    break;
  case EOpSubgroupClusteredAdd:
  case EOpSubgroupClusteredMul:
  case EOpSubgroupClusteredMin:
  case EOpSubgroupClusteredMax:
  case EOpSubgroupClusteredAnd:
  case EOpSubgroupClusteredOr:
  case EOpSubgroupClusteredXor:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformClustered);
    break;
  case EOpSubgroupQuadBroadcast:
  case EOpSubgroupQuadSwapHorizontal:
  case EOpSubgroupQuadSwapVertical:
  case EOpSubgroupQuadSwapDiagonal:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformQuad);
    break;
  case EOpSubgroupQuadAll:
  case EOpSubgroupQuadAny:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_quad_control");
    spv::Builder::addCapability(&this->builder,CapabilityQuadControlKHR);
  case EOpSubgroupAll:
  case EOpSubgroupAny:
  case EOpSubgroupAllEqual:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformVote);
    break;
  default:
    __assert_fail("0 && \"Unhandled subgroup operation!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x2285,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSubgroupOperation(glslang::TOperator, spv::Id, std::vector<spv::Id> &, glslang::TBasicType)"
                 );
  case EOpSubgroupPartitionedAdd:
  case EOpSubgroupPartitionedMul:
  case EOpSubgroupPartitionedMin:
  case EOpSubgroupPartitionedMax:
  case EOpSubgroupPartitionedAnd:
  case EOpSubgroupPartitionedOr:
  case EOpSubgroupPartitionedXor:
  case EOpSubgroupPartitionedInclusiveAdd:
  case EOpSubgroupPartitionedInclusiveMul:
  case EOpSubgroupPartitionedInclusiveMin:
  case EOpSubgroupPartitionedInclusiveMax:
  case EOpSubgroupPartitionedInclusiveAnd:
  case EOpSubgroupPartitionedInclusiveOr:
  case EOpSubgroupPartitionedInclusiveXor:
  case EOpSubgroupPartitionedExclusiveAdd:
  case EOpSubgroupPartitionedExclusiveMul:
  case EOpSubgroupPartitionedExclusiveMin:
  case EOpSubgroupPartitionedExclusiveMax:
  case EOpSubgroupPartitionedExclusiveAnd:
  case EOpSubgroupPartitionedExclusiveOr:
  case EOpSubgroupPartitionedExclusiveXor:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_subgroup_partitioned");
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformPartitionedNV);
  }
  bVar1 = glslang::isTypeUnsignedInt(typeProxy);
  bVar2 = glslang::isTypeFloat(typeProxy);
  bVar5 = typeProxy != EbtBool;
  switch(op) {
  case EOpSubgroupElect:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformElect;
    break;
  case EOpSubgroupAll:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformAll;
    break;
  case EOpSubgroupAny:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformAny;
    break;
  case EOpSubgroupAllEqual:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformAllEqual;
    break;
  case EOpSubgroupBroadcast:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformBroadcast;
    break;
  case EOpSubgroupBroadcastFirst:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformBroadcastFirst;
    break;
  case EOpSubgroupBallot:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformBallot;
    break;
  case EOpSubgroupInverseBallot:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformInverseBallot;
    break;
  case EOpSubgroupBallotBitExtract:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformBallotBitExtract;
    break;
  case EOpSubgroupBallotBitCount:
  case EOpSubgroupBallotInclusiveBitCount:
  case EOpSubgroupBallotExclusiveBitCount:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformBallotBitCount;
    break;
  case EOpSubgroupBallotFindLSB:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformBallotFindLSB;
    break;
  case EOpSubgroupBallotFindMSB:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformBallotFindMSB;
    break;
  case EOpSubgroupShuffle:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformShuffle;
    break;
  case EOpSubgroupShuffleXor:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformShuffleXor;
    break;
  case EOpSubgroupShuffleUp:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformShuffleUp;
    break;
  case EOpSubgroupShuffleDown:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformShuffleDown;
    break;
  case EOpSubgroupRotate:
  case EOpSubgroupClusteredRotate:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformRotateKHR;
    break;
  case EOpSubgroupAdd:
  case EOpSubgroupInclusiveAdd:
  case EOpSubgroupExclusiveAdd:
  case EOpSubgroupClusteredAdd:
  case EOpSubgroupPartitionedAdd:
  case EOpSubgroupPartitionedInclusiveAdd:
  case EOpSubgroupPartitionedExclusiveAdd:
    if (bVar2) {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformFAdd;
    }
    else {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformIAdd;
    }
    break;
  case EOpSubgroupMul:
  case EOpSubgroupInclusiveMul:
  case EOpSubgroupExclusiveMul:
  case EOpSubgroupClusteredMul:
  case EOpSubgroupPartitionedMul:
  case EOpSubgroupPartitionedInclusiveMul:
  case EOpSubgroupPartitionedExclusiveMul:
    if (bVar2) {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformFMul;
    }
    else {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformIMul;
    }
    break;
  case EOpSubgroupMin:
  case EOpSubgroupInclusiveMin:
  case EOpSubgroupExclusiveMin:
  case EOpSubgroupClusteredMin:
  case EOpSubgroupPartitionedMin:
  case EOpSubgroupPartitionedInclusiveMin:
  case EOpSubgroupPartitionedExclusiveMin:
    if (bVar2) {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformFMin;
    }
    else if (bVar1) {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformUMin;
    }
    else {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformSMin;
    }
    break;
  case EOpSubgroupMax:
  case EOpSubgroupInclusiveMax:
  case EOpSubgroupExclusiveMax:
  case EOpSubgroupClusteredMax:
  case EOpSubgroupPartitionedMax:
  case EOpSubgroupPartitionedInclusiveMax:
  case EOpSubgroupPartitionedExclusiveMax:
    if (bVar2) {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformFMax;
    }
    else if (bVar1) {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformUMax;
    }
    else {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformSMax;
    }
    break;
  case EOpSubgroupAnd:
  case EOpSubgroupInclusiveAnd:
  case EOpSubgroupExclusiveAnd:
  case EOpSubgroupClusteredAnd:
  case EOpSubgroupPartitionedAnd:
  case EOpSubgroupPartitionedInclusiveAnd:
  case EOpSubgroupPartitionedExclusiveAnd:
    if (bVar5) {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformBitwiseAnd;
    }
    else {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformLogicalAnd;
    }
    break;
  case EOpSubgroupOr:
  case EOpSubgroupInclusiveOr:
  case EOpSubgroupExclusiveOr:
  case EOpSubgroupClusteredOr:
  case EOpSubgroupPartitionedOr:
  case EOpSubgroupPartitionedInclusiveOr:
  case EOpSubgroupPartitionedExclusiveOr:
    if (bVar5) {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformBitwiseOr;
    }
    else {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformLogicalOr;
    }
    break;
  case EOpSubgroupXor:
  case EOpSubgroupInclusiveXor:
  case EOpSubgroupExclusiveXor:
  case EOpSubgroupClusteredXor:
  case EOpSubgroupPartitionedXor:
  case EOpSubgroupPartitionedInclusiveXor:
  case EOpSubgroupPartitionedExclusiveXor:
    if (bVar5) {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformBitwiseXor;
    }
    else {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformLogicalXor;
    }
    break;
  case EOpSubgroupQuadBroadcast:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformQuadBroadcast;
    break;
  case EOpSubgroupQuadSwapHorizontal:
  case EOpSubgroupQuadSwapVertical:
  case EOpSubgroupQuadSwapDiagonal:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformQuadSwap;
    break;
  case EOpSubgroupQuadAll:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformQuadAllKHR;
    break;
  case EOpSubgroupQuadAny:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupNonUniformQuadAnyKHR;
    break;
  default:
    __assert_fail("0 && \"Unhandled subgroup operation!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x230a,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSubgroupOperation(glslang::TOperator, spv::Id, std::vector<spv::Id> &, glslang::TBasicType)"
                 );
  }
  spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x7fffffff;
  switch(op) {
  case EOpSubgroupBallotBitCount:
  case EOpSubgroupAdd:
  case EOpSubgroupMul:
  case EOpSubgroupMin:
  case EOpSubgroupMax:
  case EOpSubgroupAnd:
  case EOpSubgroupOr:
  case EOpSubgroupXor:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    break;
  case EOpSubgroupBallotInclusiveBitCount:
  case EOpSubgroupInclusiveAdd:
  case EOpSubgroupInclusiveMul:
  case EOpSubgroupInclusiveMin:
  case EOpSubgroupInclusiveMax:
  case EOpSubgroupInclusiveAnd:
  case EOpSubgroupInclusiveOr:
  case EOpSubgroupInclusiveXor:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    break;
  case EOpSubgroupBallotExclusiveBitCount:
  case EOpSubgroupExclusiveAdd:
  case EOpSubgroupExclusiveMul:
  case EOpSubgroupExclusiveMin:
  case EOpSubgroupExclusiveMax:
  case EOpSubgroupExclusiveAnd:
  case EOpSubgroupExclusiveOr:
  case EOpSubgroupExclusiveXor:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
    break;
  default:
    break;
  case EOpSubgroupClusteredAdd:
  case EOpSubgroupClusteredMul:
  case EOpSubgroupClusteredMin:
  case EOpSubgroupClusteredMax:
  case EOpSubgroupClusteredAnd:
  case EOpSubgroupClusteredOr:
  case EOpSubgroupClusteredXor:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._0_4_ = 3;
    break;
  case EOpSubgroupPartitionedAdd:
  case EOpSubgroupPartitionedMul:
  case EOpSubgroupPartitionedMin:
  case EOpSubgroupPartitionedMax:
  case EOpSubgroupPartitionedAnd:
  case EOpSubgroupPartitionedOr:
  case EOpSubgroupPartitionedXor:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    break;
  case EOpSubgroupPartitionedInclusiveAdd:
  case EOpSubgroupPartitionedInclusiveMul:
  case EOpSubgroupPartitionedInclusiveMin:
  case EOpSubgroupPartitionedInclusiveMax:
  case EOpSubgroupPartitionedInclusiveAnd:
  case EOpSubgroupPartitionedInclusiveOr:
  case EOpSubgroupPartitionedInclusiveXor:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._0_4_ = 7;
    break;
  case EOpSubgroupPartitionedExclusiveAdd:
  case EOpSubgroupPartitionedExclusiveMul:
  case EOpSubgroupPartitionedExclusiveMin:
  case EOpSubgroupPartitionedExclusiveMax:
  case EOpSubgroupPartitionedExclusiveAnd:
  case EOpSubgroupPartitionedExclusiveOr:
  case EOpSubgroupPartitionedExclusiveXor:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._0_4_ = 8;
  }
  std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::vector
            ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&executionScope);
  IVar3 = spv::Builder::makeUintConstant(&this->builder,3,false);
  spv::IdImmediate::IdImmediate(&groupOperand,true,IVar3);
  if ((spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != OpGroupNonUniformQuadAllKHR) &&
     (spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != OpGroupNonUniformQuadAnyKHR)) {
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
              ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&executionScope,
               &groupOperand);
  }
  if ((uint)spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != 0x7fffffff) {
    spv::IdImmediate::IdImmediate
              ((IdImmediate *)&opIt,false,
               (uint)spvGroupOperands.
                     super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
              ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&executionScope,
               (value_type *)&opIt);
  }
  local_60._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin(operands);
  while( true ) {
    operand = (IdImmediate)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cend(operands);
    bVar1 = __gnu_cxx::operator!=
                      (&local_60,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&operand);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_60);
    spv::IdImmediate::IdImmediate((IdImmediate *)&direction.word,true,*puVar4);
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
              ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&executionScope,
               (value_type *)&direction.word);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_60);
  }
  direction.isId = false;
  direction._1_3_ = 0;
  if (op == EOpSubgroupQuadSwapHorizontal) {
    direction._0_4_ = spv::Builder::makeUintConstant(&this->builder,0,false);
  }
  else if (op == EOpSubgroupQuadSwapVertical) {
    direction._0_4_ = spv::Builder::makeUintConstant(&this->builder,1,false);
  }
  else if (op == EOpSubgroupQuadSwapDiagonal) {
    direction._0_4_ = spv::Builder::makeUintConstant(&this->builder,2,false);
  }
  if (direction._0_4_ != 0) {
    spv::IdImmediate::IdImmediate(&local_7c,true,direction._0_4_);
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
              ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&executionScope,
               &local_7c);
  }
  IVar3 = spv::Builder::createOp
                    (&this->builder,
                     spvGroupOperands.
                     super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage._4_4_,typeId,
                     (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&executionScope)
  ;
  std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::~vector
            ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&executionScope);
  return IVar3;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createSubgroupOperation(glslang::TOperator op, spv::Id typeId,
    std::vector<spv::Id>& operands, glslang::TBasicType typeProxy)
{
    // Add the required capabilities.
    switch (op) {
    case glslang::EOpSubgroupElect:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        break;
    case glslang::EOpSubgroupQuadAll:
    case glslang::EOpSubgroupQuadAny:
        builder.addExtension(spv::E_SPV_KHR_quad_control);
        builder.addCapability(spv::CapabilityQuadControlKHR);
        [[fallthrough]];
    case glslang::EOpSubgroupAll:
    case glslang::EOpSubgroupAny:
    case glslang::EOpSubgroupAllEqual:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformVote);
        break;
    case glslang::EOpSubgroupBroadcast:
    case glslang::EOpSubgroupBroadcastFirst:
    case glslang::EOpSubgroupBallot:
    case glslang::EOpSubgroupInverseBallot:
    case glslang::EOpSubgroupBallotBitExtract:
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupBallotExclusiveBitCount:
    case glslang::EOpSubgroupBallotFindLSB:
    case glslang::EOpSubgroupBallotFindMSB:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        break;
    case glslang::EOpSubgroupRotate:
    case glslang::EOpSubgroupClusteredRotate:
        builder.addExtension(spv::E_SPV_KHR_subgroup_rotate);
        builder.addCapability(spv::CapabilityGroupNonUniformRotateKHR);
        break;
    case glslang::EOpSubgroupShuffle:
    case glslang::EOpSubgroupShuffleXor:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformShuffle);
        break;
    case glslang::EOpSubgroupShuffleUp:
    case glslang::EOpSubgroupShuffleDown:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformShuffleRelative);
        break;
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupXor:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupInclusiveXor:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupExclusiveXor:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
        break;
    case glslang::EOpSubgroupClusteredAdd:
    case glslang::EOpSubgroupClusteredMul:
    case glslang::EOpSubgroupClusteredMin:
    case glslang::EOpSubgroupClusteredMax:
    case glslang::EOpSubgroupClusteredAnd:
    case glslang::EOpSubgroupClusteredOr:
    case glslang::EOpSubgroupClusteredXor:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformClustered);
        break;
    case glslang::EOpSubgroupQuadBroadcast:
    case glslang::EOpSubgroupQuadSwapHorizontal:
    case glslang::EOpSubgroupQuadSwapVertical:
    case glslang::EOpSubgroupQuadSwapDiagonal:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformQuad);
        break;
    case glslang::EOpSubgroupPartitionedAdd:
    case glslang::EOpSubgroupPartitionedMul:
    case glslang::EOpSubgroupPartitionedMin:
    case glslang::EOpSubgroupPartitionedMax:
    case glslang::EOpSubgroupPartitionedAnd:
    case glslang::EOpSubgroupPartitionedOr:
    case glslang::EOpSubgroupPartitionedXor:
    case glslang::EOpSubgroupPartitionedInclusiveAdd:
    case glslang::EOpSubgroupPartitionedInclusiveMul:
    case glslang::EOpSubgroupPartitionedInclusiveMin:
    case glslang::EOpSubgroupPartitionedInclusiveMax:
    case glslang::EOpSubgroupPartitionedInclusiveAnd:
    case glslang::EOpSubgroupPartitionedInclusiveOr:
    case glslang::EOpSubgroupPartitionedInclusiveXor:
    case glslang::EOpSubgroupPartitionedExclusiveAdd:
    case glslang::EOpSubgroupPartitionedExclusiveMul:
    case glslang::EOpSubgroupPartitionedExclusiveMin:
    case glslang::EOpSubgroupPartitionedExclusiveMax:
    case glslang::EOpSubgroupPartitionedExclusiveAnd:
    case glslang::EOpSubgroupPartitionedExclusiveOr:
    case glslang::EOpSubgroupPartitionedExclusiveXor:
        builder.addExtension(spv::E_SPV_NV_shader_subgroup_partitioned);
        builder.addCapability(spv::CapabilityGroupNonUniformPartitionedNV);
        break;
    default: assert(0 && "Unhandled subgroup operation!");
    }


    const bool isUnsigned = isTypeUnsignedInt(typeProxy);
    const bool isFloat = isTypeFloat(typeProxy);
    const bool isBool = typeProxy == glslang::EbtBool;

    spv::Op opCode = spv::OpNop;

    // Figure out which opcode to use.
    switch (op) {
    case glslang::EOpSubgroupElect:                   opCode = spv::OpGroupNonUniformElect; break;
    case glslang::EOpSubgroupQuadAll:                 opCode = spv::OpGroupNonUniformQuadAllKHR; break;
    case glslang::EOpSubgroupAll:                     opCode = spv::OpGroupNonUniformAll; break;
    case glslang::EOpSubgroupQuadAny:                 opCode = spv::OpGroupNonUniformQuadAnyKHR; break;
    case glslang::EOpSubgroupAny:                     opCode = spv::OpGroupNonUniformAny; break;
    case glslang::EOpSubgroupAllEqual:                opCode = spv::OpGroupNonUniformAllEqual; break;
    case glslang::EOpSubgroupBroadcast:               opCode = spv::OpGroupNonUniformBroadcast; break;
    case glslang::EOpSubgroupBroadcastFirst:          opCode = spv::OpGroupNonUniformBroadcastFirst; break;
    case glslang::EOpSubgroupBallot:                  opCode = spv::OpGroupNonUniformBallot; break;
    case glslang::EOpSubgroupInverseBallot:           opCode = spv::OpGroupNonUniformInverseBallot; break;
    case glslang::EOpSubgroupBallotBitExtract:        opCode = spv::OpGroupNonUniformBallotBitExtract; break;
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupBallotExclusiveBitCount: opCode = spv::OpGroupNonUniformBallotBitCount; break;
    case glslang::EOpSubgroupBallotFindLSB:           opCode = spv::OpGroupNonUniformBallotFindLSB; break;
    case glslang::EOpSubgroupBallotFindMSB:           opCode = spv::OpGroupNonUniformBallotFindMSB; break;
    case glslang::EOpSubgroupShuffle:                 opCode = spv::OpGroupNonUniformShuffle; break;
    case glslang::EOpSubgroupShuffleXor:              opCode = spv::OpGroupNonUniformShuffleXor; break;
    case glslang::EOpSubgroupShuffleUp:               opCode = spv::OpGroupNonUniformShuffleUp; break;
    case glslang::EOpSubgroupShuffleDown:             opCode = spv::OpGroupNonUniformShuffleDown; break;
    case glslang::EOpSubgroupRotate:
    case glslang::EOpSubgroupClusteredRotate:         opCode = spv::OpGroupNonUniformRotateKHR; break;
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupClusteredAdd:
    case glslang::EOpSubgroupPartitionedAdd:
    case glslang::EOpSubgroupPartitionedInclusiveAdd:
    case glslang::EOpSubgroupPartitionedExclusiveAdd:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFAdd;
        } else {
            opCode = spv::OpGroupNonUniformIAdd;
        }
        break;
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupClusteredMul:
    case glslang::EOpSubgroupPartitionedMul:
    case glslang::EOpSubgroupPartitionedInclusiveMul:
    case glslang::EOpSubgroupPartitionedExclusiveMul:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFMul;
        } else {
            opCode = spv::OpGroupNonUniformIMul;
        }
        break;
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupClusteredMin:
    case glslang::EOpSubgroupPartitionedMin:
    case glslang::EOpSubgroupPartitionedInclusiveMin:
    case glslang::EOpSubgroupPartitionedExclusiveMin:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFMin;
        } else if (isUnsigned) {
            opCode = spv::OpGroupNonUniformUMin;
        } else {
            opCode = spv::OpGroupNonUniformSMin;
        }
        break;
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupClusteredMax:
    case glslang::EOpSubgroupPartitionedMax:
    case glslang::EOpSubgroupPartitionedInclusiveMax:
    case glslang::EOpSubgroupPartitionedExclusiveMax:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFMax;
        } else if (isUnsigned) {
            opCode = spv::OpGroupNonUniformUMax;
        } else {
            opCode = spv::OpGroupNonUniformSMax;
        }
        break;
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupClusteredAnd:
    case glslang::EOpSubgroupPartitionedAnd:
    case glslang::EOpSubgroupPartitionedInclusiveAnd:
    case glslang::EOpSubgroupPartitionedExclusiveAnd:
        if (isBool) {
            opCode = spv::OpGroupNonUniformLogicalAnd;
        } else {
            opCode = spv::OpGroupNonUniformBitwiseAnd;
        }
        break;
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupClusteredOr:
    case glslang::EOpSubgroupPartitionedOr:
    case glslang::EOpSubgroupPartitionedInclusiveOr:
    case glslang::EOpSubgroupPartitionedExclusiveOr:
        if (isBool) {
            opCode = spv::OpGroupNonUniformLogicalOr;
        } else {
            opCode = spv::OpGroupNonUniformBitwiseOr;
        }
        break;
    case glslang::EOpSubgroupXor:
    case glslang::EOpSubgroupInclusiveXor:
    case glslang::EOpSubgroupExclusiveXor:
    case glslang::EOpSubgroupClusteredXor:
    case glslang::EOpSubgroupPartitionedXor:
    case glslang::EOpSubgroupPartitionedInclusiveXor:
    case glslang::EOpSubgroupPartitionedExclusiveXor:
        if (isBool) {
            opCode = spv::OpGroupNonUniformLogicalXor;
        } else {
            opCode = spv::OpGroupNonUniformBitwiseXor;
        }
        break;
    case glslang::EOpSubgroupQuadBroadcast:      opCode = spv::OpGroupNonUniformQuadBroadcast; break;
    case glslang::EOpSubgroupQuadSwapHorizontal:
    case glslang::EOpSubgroupQuadSwapVertical:
    case glslang::EOpSubgroupQuadSwapDiagonal:   opCode = spv::OpGroupNonUniformQuadSwap; break;
    default: assert(0 && "Unhandled subgroup operation!");
    }

    // get the right Group Operation
    spv::GroupOperation groupOperation = spv::GroupOperationMax;
    switch (op) {
    default:
        break;
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupXor:
        groupOperation = spv::GroupOperationReduce;
        break;
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupInclusiveXor:
        groupOperation = spv::GroupOperationInclusiveScan;
        break;
    case glslang::EOpSubgroupBallotExclusiveBitCount:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupExclusiveXor:
        groupOperation = spv::GroupOperationExclusiveScan;
        break;
    case glslang::EOpSubgroupClusteredAdd:
    case glslang::EOpSubgroupClusteredMul:
    case glslang::EOpSubgroupClusteredMin:
    case glslang::EOpSubgroupClusteredMax:
    case glslang::EOpSubgroupClusteredAnd:
    case glslang::EOpSubgroupClusteredOr:
    case glslang::EOpSubgroupClusteredXor:
        groupOperation = spv::GroupOperationClusteredReduce;
        break;
    case glslang::EOpSubgroupPartitionedAdd:
    case glslang::EOpSubgroupPartitionedMul:
    case glslang::EOpSubgroupPartitionedMin:
    case glslang::EOpSubgroupPartitionedMax:
    case glslang::EOpSubgroupPartitionedAnd:
    case glslang::EOpSubgroupPartitionedOr:
    case glslang::EOpSubgroupPartitionedXor:
        groupOperation = spv::GroupOperationPartitionedReduceNV;
        break;
    case glslang::EOpSubgroupPartitionedInclusiveAdd:
    case glslang::EOpSubgroupPartitionedInclusiveMul:
    case glslang::EOpSubgroupPartitionedInclusiveMin:
    case glslang::EOpSubgroupPartitionedInclusiveMax:
    case glslang::EOpSubgroupPartitionedInclusiveAnd:
    case glslang::EOpSubgroupPartitionedInclusiveOr:
    case glslang::EOpSubgroupPartitionedInclusiveXor:
        groupOperation = spv::GroupOperationPartitionedInclusiveScanNV;
        break;
    case glslang::EOpSubgroupPartitionedExclusiveAdd:
    case glslang::EOpSubgroupPartitionedExclusiveMul:
    case glslang::EOpSubgroupPartitionedExclusiveMin:
    case glslang::EOpSubgroupPartitionedExclusiveMax:
    case glslang::EOpSubgroupPartitionedExclusiveAnd:
    case glslang::EOpSubgroupPartitionedExclusiveOr:
    case glslang::EOpSubgroupPartitionedExclusiveXor:
        groupOperation = spv::GroupOperationPartitionedExclusiveScanNV;
        break;
    }

    // build the instruction
    std::vector<spv::IdImmediate> spvGroupOperands;

    // Every operation begins with the Execution Scope operand.
    spv::IdImmediate executionScope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
    // All other ops need the execution scope. Quad Control Ops don't need scope, it's always Quad.
    if (opCode != spv::OpGroupNonUniformQuadAllKHR && opCode != spv::OpGroupNonUniformQuadAnyKHR) {
        spvGroupOperands.push_back(executionScope);
    }

    // Next, for all operations that use a Group Operation, push that as an operand.
    if (groupOperation != spv::GroupOperationMax) {
        spv::IdImmediate groupOperand = { false, (unsigned)groupOperation };
        spvGroupOperands.push_back(groupOperand);
    }

    // Push back the operands next.
    for (auto opIt = operands.cbegin(); opIt != operands.cend(); ++opIt) {
        spv::IdImmediate operand = { true, *opIt };
        spvGroupOperands.push_back(operand);
    }

    // Some opcodes have additional operands.
    spv::Id directionId = spv::NoResult;
    switch (op) {
    default: break;
    case glslang::EOpSubgroupQuadSwapHorizontal: directionId = builder.makeUintConstant(0); break;
    case glslang::EOpSubgroupQuadSwapVertical:   directionId = builder.makeUintConstant(1); break;
    case glslang::EOpSubgroupQuadSwapDiagonal:   directionId = builder.makeUintConstant(2); break;
    }
    if (directionId != spv::NoResult) {
        spv::IdImmediate direction = { true, directionId };
        spvGroupOperands.push_back(direction);
    }

    return builder.createOp(opCode, typeId, spvGroupOperands);
}